

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_test.c
# Opt level: O2

void * thread_decode(void *arg)

{
  uint uVar1;
  undefined8 uVar2;
  MppFrame pvVar3;
  FrmCrc *pFVar4;
  MPP_RET MVar5;
  int iVar6;
  int iVar7;
  RK_U32 size;
  int iVar8;
  undefined8 uVar9;
  MppBufferGroup pvVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  bool bVar16;
  float fVar17;
  MppFrame in_stack_fffffffffffffe28;
  undefined4 uVar18;
  MppFrame frame;
  byte local_199;
  uint local_198;
  uint local_194;
  FileBufSlot *slot;
  FileBufSlot *local_188;
  int local_17c;
  undefined4 local_178;
  int local_174;
  long local_170;
  undefined8 local_168;
  undefined4 local_15c;
  undefined4 local_158;
  int local_154;
  long local_150;
  FrmCrc *local_148;
  MppFrame local_140;
  char log_buf [256];
  
  lVar13 = *arg;
  uVar2 = *(undefined8 *)((long)arg + 8);
  lVar14 = *(long *)((long)arg + 0x10);
  local_148 = (FrmCrc *)((long)arg + 0x88);
  *(undefined8 *)((long)arg + 0x88) = 0;
  *(undefined8 *)((long)arg + 0x90) = 0;
  *(undefined8 *)((long)arg + 0x98) = 0;
  *(undefined8 *)((long)arg + 0xa0) = 0;
  *(undefined8 *)((long)arg + 0xa8) = 0;
  *(undefined8 *)((long)arg + 0xb0) = 0;
  uVar9 = mpp_osal_malloc("thread_decode",0x1000);
  *(undefined8 *)((long)arg + 0x90) = uVar9;
  uVar9 = mpp_osal_malloc("thread_decode",0x1000);
  *(undefined8 *)((long)arg + 0xa8) = uVar9;
  local_150 = mpp_time();
  if (*(int *)(lVar13 + 0x218) == 0) {
    uVar1 = *(uint *)(lVar13 + 0x204);
    if (((uVar1 & 0xf0000) == 0 && (uVar1 & 0xfffc) < 0x14) ||
       ((uVar1 & 0x1fff0) < 0x10010 && (uVar1 & 0xf0000) == 0x10000)) {
      iVar6 = (**(code **)(lVar14 + 0x70))(uVar2,0x31000a,(undefined4 *)(lVar13 + 0x204));
      if (iVar6 != 0) {
        _mpp_log_l(2,"mpi_dec_test","Failed to set output format 0x%x\n",0,
                   *(undefined4 *)(lVar13 + 0x204));
        return (void *)0x0;
      }
    }
    while (uVar18 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20),
          *(int *)((long)arg + 0x1c) == 0) {
      lVar13 = *arg;
      uVar2 = *(undefined8 *)((long)arg + 8);
      lVar14 = *(long *)((long)arg + 0x10);
      log_buf[0] = '\0';
      log_buf[1] = '\0';
      log_buf[2] = '\0';
      log_buf[3] = '\0';
      log_buf[4] = '\0';
      log_buf[5] = '\0';
      log_buf[6] = '\0';
      log_buf[7] = '\0';
      slot = (FileBufSlot *)0x0;
      pvVar3 = *(MppFrame *)((long)arg + 0x38);
      frame = (MppFrame)0x0;
      local_174 = *(int *)((long)arg + 0x18);
      local_188 = (FileBufSlot *)0x0;
      MVar5 = reader_index_read(*(FileReader *)(lVar13 + 0x240),0,&local_188);
      if (MVar5 != MPP_OK) {
        in_stack_fffffffffffffe28 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),0x115);
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK",
                   "dec_advanced",in_stack_fffffffffffffe28);
        if ((DAT_001102fb & 0x10) != 0) goto LAB_001053f0;
      }
      if (local_188 == (FileBufSlot *)0x0) {
        in_stack_fffffffffffffe28 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),0x116);
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"slot","dec_advanced",
                   in_stack_fffffffffffffe28);
        if ((DAT_001102fb & 0x10) != 0) goto LAB_001053f0;
      }
      mpp_packet_init_with_buffer(log_buf,local_188->buf);
      if (local_188->eos != 0) {
        mpp_packet_set_eos(log_buf._0_8_);
      }
      lVar12 = mpp_packet_get_meta(log_buf._0_8_);
      if (lVar12 != 0) {
        mpp_meta_set_frame(lVar12,0x6f66726d,pvVar3);
      }
      iVar6 = (**(code **)(lVar14 + 0x10))(uVar2,log_buf._0_8_);
      if (iVar6 == 0) {
        if (*(long *)((long)arg + 0x50) == 0) {
          uVar9 = mpp_time();
          *(undefined8 *)((long)arg + 0x50) = uVar9;
        }
        iVar6 = (**(code **)(lVar14 + 0x18))(uVar2,&frame);
        if (iVar6 != 0 || frame == (MppFrame)0x0) {
          pcVar15 = "%p mpp decode get frame failed ret %d frame %p\n";
          in_stack_fffffffffffffe28 = frame;
          goto LAB_001052a1;
        }
        if (*(long *)((long)arg + 0x58) == 0) {
          uVar9 = mpp_time();
          *(undefined8 *)((long)arg + 0x58) = uVar9;
        }
        if (frame != pvVar3) {
          _mpp_log_l(2,"mpi_dec_test","mismatch frame %p -> %p\n","dec_advanced",frame,pvVar3);
        }
        if (*(FILE **)((long)arg + 0x40) != (FILE *)0x0) {
          dump_mpp_frame_to_file(frame,*(FILE **)((long)arg + 0x40));
        }
        pFVar4 = local_148;
        if (*(long *)((long)arg + 0x80) != 0) {
          calc_frm_crc(frame,local_148);
          write_frm_crc(*(FILE **)((long)arg + 0x80),pFVar4);
        }
        iVar6 = local_174;
        if (local_174 == 0) {
          _mpp_log_l(4,"mpi_dec_test","%p decoded frame %d\n",0,uVar2,
                     *(undefined4 *)((long)arg + 0x48));
        }
        *(int *)((long)arg + 0x48) = *(int *)((long)arg + 0x48) + 1;
        iVar7 = mpp_frame_get_eos(frame);
        if ((iVar6 == 0) && (iVar7 != 0)) {
          _mpp_log_l(4,"mpi_dec_test","%p found eos frame\n",0,uVar2);
        }
        fps_calc_inc(*(FpsCalc *)(lVar13 + 0x248));
        lVar13 = mpp_frame_get_meta(pvVar3);
        if (lVar13 == 0) {
LAB_0010527d:
          iVar6 = *(int *)((long)arg + 0x4c);
          if (iVar6 < 1) {
            if ((iVar6 == 0) && (local_188->eos != 0)) goto LAB_001052b0;
            goto LAB_001052bc;
          }
          if (*(int *)((long)arg + 0x48) < iVar6) goto LAB_001052bc;
          goto LAB_001052b0;
        }
        iVar6 = mpp_meta_get_packet(lVar13,0x69706b74,&slot);
        if (iVar6 == 0 && slot != (FileBufSlot *)0x0) {
          if (slot != (FileBufSlot *)log_buf._0_8_) {
            _mpp_log_l(2,"mpi_dec_test","mismatch packet %p -> %p\n","dec_advanced");
          }
          goto LAB_0010527d;
        }
        _mpp_log_l(2,"mpi_dec_test","%p mpp meta get packet failed ret %d\n",0,uVar2,iVar6);
      }
      else {
        pcVar15 = "%p mpp decode put packet failed ret %d\n";
LAB_001052a1:
        _mpp_log_l(2,"mpi_dec_test",pcVar15,0,uVar2,iVar6);
LAB_001052b0:
        *(undefined4 *)((long)arg + 0x1c) = 1;
      }
LAB_001052bc:
      mpp_packet_deinit(log_buf);
    }
  }
  else {
LAB_00104867:
    uVar18 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    if (*(int *)((long)arg + 0x1c) == 0) {
      local_170 = *arg;
      uVar2 = *(undefined8 *)((long)arg + 8);
      lVar13 = *(long *)((long)arg + 0x10);
      local_168 = *(undefined8 *)((long)arg + 0x30);
      slot = (FileBufSlot *)0x0;
      local_194 = *(uint *)((long)arg + 0x18);
      uVar11 = (ulong)local_194;
      MVar5 = reader_read(*(FileReader *)(local_170 + 0x240),&slot);
      if (MVar5 != MPP_OK) {
        in_stack_fffffffffffffe28 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),0x4e);
        uVar11 = 0;
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK","dec_simple",
                   in_stack_fffffffffffffe28);
        if ((DAT_001102fb & 0x10) != 0) {
LAB_001053f0:
          abort();
        }
      }
      if (slot == (FileBufSlot *)0x0) {
        in_stack_fffffffffffffe28 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),0x4f);
        uVar11 = 0;
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"slot","dec_simple",
                   in_stack_fffffffffffffe28);
        if ((DAT_001102fb & 0x10) != 0) goto LAB_001053f0;
      }
      local_178 = (undefined4)CONCAT71((int7)(uVar11 >> 8),1);
      if (slot->eos != 0) {
        if ((*(int *)((long)arg + 0x4c) < 0) ||
           (*(int *)((long)arg + 0x48) < *(int *)((long)arg + 0x4c))) {
          if (local_194 == 0) {
            _mpp_log_l(4,"mpi_dec_test","%p loop again\n",0,uVar2);
          }
          reader_rewind(*(FileReader *)(local_170 + 0x240));
        }
        else {
          if (local_194 == 0) {
            _mpp_log_l(4,"mpi_dec_test","%p found last packet\n",0,uVar2);
          }
          *(undefined4 *)((long)arg + 0x1c) = 1;
          local_178 = 0;
        }
      }
      uVar9 = local_168;
      mpp_packet_set_data(local_168,slot->data);
      mpp_packet_set_size(uVar9,slot->size);
      mpp_packet_set_pos(uVar9,slot->data);
      mpp_packet_set_length(uVar9,slot->size);
      if ((char)local_178 == '\0') {
        mpp_packet_set_eos(local_168);
      }
      iVar6 = 0;
      do {
        iVar8 = 0;
        iVar7 = 1;
        if (iVar6 == 0) {
          iVar6 = (**(code **)(lVar13 + 0x10))(uVar2,local_168);
          iVar8 = 1;
          iVar7 = 0;
          if (iVar6 == 0) {
            if (*(long *)((long)arg + 0x50) == 0) {
              uVar9 = mpp_time();
              *(undefined8 *)((long)arg + 0x50) = uVar9;
            }
            iVar8 = 0;
            iVar7 = 1;
          }
        }
        local_154 = iVar7;
        local_199 = (byte)local_178 | (byte)iVar8;
        iVar6 = 0x1e;
        local_174 = iVar8;
LAB_00104a72:
        do {
          frame = (MppFrame)0x0;
          while (iVar7 = (**(code **)(lVar13 + 0x18))(uVar2,&frame), iVar7 == -8) {
            if (iVar6 < 1) {
              _mpp_log_l(2,"mpi_dec_test","%p decode_get_frame failed too much time\n",0,uVar2);
              goto LAB_00104dfc;
            }
            iVar6 = iVar6 + -1;
            usleep(1000);
          }
          if (iVar7 != 0) {
LAB_00104dfc:
            bVar16 = false;
            _mpp_log_l(2,"mpi_dec_test","%p decode_get_frame failed ret %d\n",0,iVar7,uVar2);
            goto LAB_00104e20;
          }
          local_140 = frame;
          if (frame != (MppFrame)0x0) {
            iVar7 = mpp_frame_get_info_change();
            if (iVar7 == 0) {
              local_198 = mpp_frame_get_errinfo(frame);
              local_17c = mpp_frame_get_discard(frame);
              if (*(long *)((long)arg + 0x58) == 0) {
                uVar9 = mpp_time();
                *(undefined8 *)((long)arg + 0x58) = uVar9;
              }
              iVar7 = snprintf(log_buf,0xff,"decode get frame %d",(ulong)*(uint *)((long)arg + 0x48)
                              );
              iVar8 = mpp_frame_has_meta(frame);
              if (iVar8 != 0) {
                uVar9 = mpp_frame_get_meta(frame);
                local_188 = (FileBufSlot *)((ulong)local_188 & 0xffffffff00000000);
                mpp_meta_get_s32(uVar9,0x746c6964,&local_188);
                iVar8 = snprintf(log_buf + iVar7,(long)(0xff - iVar7)," tid %d",
                                 (ulong)local_188 & 0xffffffff);
                iVar7 = iVar7 + iVar8;
              }
              if (local_198 != 0 || local_17c != 0) {
                snprintf(log_buf + iVar7,(long)(0xff - iVar7)," err %x discard %x",(ulong)local_198)
                ;
              }
              if (local_194 == 0) {
                _mpp_log_l(4,"mpi_dec_test","%p %s\n",0,uVar2,log_buf);
              }
              *(int *)((long)arg + 0x48) = *(int *)((long)arg + 0x48) + 1;
              if (*(FILE **)((long)arg + 0x40) != (FILE *)0x0 && local_198 == 0) {
                dump_mpp_frame_to_file(frame,*(FILE **)((long)arg + 0x40));
              }
              pFVar4 = local_148;
              if (*(long *)((long)arg + 0x80) != 0) {
                calc_frm_crc(frame,local_148);
                write_frm_crc(*(FILE **)((long)arg + 0x80),pFVar4);
              }
              fps_calc_inc(*(FpsCalc *)(local_170 + 0x248));
LAB_00104d63:
              iVar7 = mpp_frame_get_eos(frame);
              mpp_frame_deinit(&frame);
              bVar16 = iVar7 != 0;
              goto LAB_00104d7c;
            }
            local_198 = mpp_frame_get_width(frame);
            local_17c = mpp_frame_get_height(frame);
            local_158 = mpp_frame_get_hor_stride(frame);
            local_15c = mpp_frame_get_ver_stride(frame);
            size = mpp_frame_get_buf_size(frame);
            uVar18 = (undefined4)((ulong)in_stack_fffffffffffffe28 >> 0x20);
            if (local_194 == 0) {
              _mpp_log_l(4,"mpi_dec_test","%p decode_get_frame get info changed found\n",0,uVar2);
              in_stack_fffffffffffffe28 = (MppFrame)CONCAT44(uVar18,local_17c);
              _mpp_log_l(4,"mpi_dec_test",
                         "%p decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",0,uVar2,
                         local_198,in_stack_fffffffffffffe28,local_158,local_15c,size);
            }
            pvVar10 = dec_buf_mgr_setup(*(DecBufMgr *)((long)arg + 0x20),size,0x18,
                                        *(MppDecBufMode *)(local_170 + 0x230));
            iVar7 = (**(code **)(lVar13 + 0x70))(uVar2,0x310002,pvVar10);
            if (iVar7 == 0) {
              *(MppBufferGroup *)((long)arg + 0x28) = pvVar10;
              iVar7 = (**(code **)(lVar13 + 0x70))(uVar2,0x310003,0);
              if (iVar7 == 0) goto LAB_00104d63;
              bVar16 = false;
              _mpp_log_l(2,"mpi_dec_test","%p info change ready failed ret %d\n",0,uVar2,iVar7);
            }
            else {
              bVar16 = false;
              _mpp_log_l(2,"mpi_dec_test","%p set buffer group failed ret %d\n",0,uVar2,iVar7);
            }
            goto LAB_00104e20;
          }
          bVar16 = false;
LAB_00104d7c:
          if ((*(long *)((long)arg + 0x28) != 0) &&
             (uVar11 = mpp_buffer_group_usage(), *(ulong *)((long)arg + 0x60) < uVar11)) {
            *(ulong *)((long)arg + 0x60) = uVar11;
          }
          if ((local_199 & 1) == 0 && !bVar16) {
            usleep(1000);
            goto LAB_00104a72;
          }
          if (bVar16) {
            bVar16 = true;
            if (local_194 == 0) {
              _mpp_log_l(4,"mpi_dec_test","%p found last packet\n",0,uVar2);
            }
LAB_00104e20:
            iVar7 = *(int *)((long)arg + 0x4c);
            goto LAB_00104e23;
          }
          iVar7 = *(int *)((long)arg + 0x4c);
          if ((0 < iVar7) && (iVar7 <= *(int *)((long)arg + 0x48))) {
            bVar16 = false;
            goto LAB_00104e20;
          }
        } while (local_140 != (MppFrame)0x0);
        bVar16 = false;
LAB_00104e23:
        if (iVar7 < 1) {
          if (bVar16 && iVar7 == 0) goto LAB_00104eee;
        }
        else if (iVar7 <= *(int *)((long)arg + 0x48)) {
LAB_00104eee:
          *(undefined4 *)((long)arg + 0x1c) = 1;
          goto LAB_00104867;
        }
        if ((char)local_174 == '\0') goto LAB_00104867;
        usleep(1000);
        iVar6 = local_154;
      } while( true );
    }
  }
  lVar13 = mpp_time();
  lVar13 = lVar13 - local_150;
  *(long *)((long)arg + 0x70) = lVar13;
  fVar17 = ((float)*(int *)((long)arg + 0x48) * 1e+06) / (float)lVar13;
  *(float *)((long)arg + 0x68) = fVar17;
  lVar14 = *(long *)((long)arg + 0x58) - *(long *)((long)arg + 0x50);
  *(long *)((long)arg + 0x78) = lVar14;
  _mpp_log_l(SUB84((double)fVar17,0),4,"mpi_dec_test",
             "decode %d frames time %lld ms delay %3d ms fps %3.2f\n",0,*(int *)((long)arg + 0x48),
             lVar13 / 1000,CONCAT44(uVar18,(int)(lVar14 / 1000)));
  if (*(long *)((long)arg + 0x90) != 0) {
    mpp_osal_free("thread_decode");
  }
  *(undefined8 *)((long)arg + 0x90) = 0;
  if (*(long *)((long)arg + 0xa8) != 0) {
    mpp_osal_free("thread_decode");
  }
  *(undefined8 *)((long)arg + 0xa8) = 0;
  return (void *)0x0;
}

Assistant:

void *thread_decode(void *arg)
{
    MpiDecLoopData *data = (MpiDecLoopData *)arg;
    MpiDecTestCmd *cmd = data->cmd;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    RK_S64 t_s, t_e;

    memset(&data->checkcrc, 0, sizeof(data->checkcrc));
    data->checkcrc.luma.sum = mpp_malloc(RK_ULONG, 512);
    data->checkcrc.chroma.sum = mpp_malloc(RK_ULONG, 512);

    t_s = mpp_time();

    if (cmd->simple) {
        while (!data->loop_end)
            dec_simple(data);
    } else {
        /* NOTE: change output format before jpeg decoding */
        if (MPP_FRAME_FMT_IS_YUV(cmd->format) || MPP_FRAME_FMT_IS_RGB(cmd->format)) {
            MPP_RET ret = mpi->control(ctx, MPP_DEC_SET_OUTPUT_FORMAT, &cmd->format);
            if (ret) {
                mpp_err("Failed to set output format 0x%x\n", cmd->format);
                return NULL;
            }
        }

        while (!data->loop_end)
            dec_advanced(data);
    }

    t_e = mpp_time();
    data->elapsed_time = t_e - t_s;
    data->frame_count = data->frame_count;
    data->frame_rate = (float)data->frame_count * 1000000 / data->elapsed_time;
    data->delay = data->first_frm - data->first_pkt;

    mpp_log("decode %d frames time %lld ms delay %3d ms fps %3.2f\n",
            data->frame_count, (RK_S64)(data->elapsed_time / 1000),
            (RK_S32)(data->delay / 1000), data->frame_rate);

    MPP_FREE(data->checkcrc.luma.sum);
    MPP_FREE(data->checkcrc.chroma.sum);

    return NULL;
}